

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_prng(uchar *out32,secp256k1_sha256 *hasher,uint32_t cnt)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  secp256k1_fe *psVar9;
  secp256k1_sha256 *psVar10;
  secp256k1_sha256 *psVar11;
  int iVar12;
  secp256k1_sha256 *psVar13;
  secp256k1_sha256 *psVar14;
  secp256k1_fe *psVar15;
  secp256k1_fe *psVar16;
  ulong uVar17;
  uint64_t *puVar18;
  uint64_t *puVar19;
  secp256k1_fe *psVar20;
  secp256k1_sha256 *psVar21;
  int iVar22;
  undefined1 *puVar23;
  secp256k1_sha256 *hash_00;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  uchar buf4 [4];
  secp256k1_sha256 hash;
  secp256k1_fe sStack_2e0;
  secp256k1_sha256 *psStack_2b0;
  secp256k1_sha256 *psStack_2a8;
  secp256k1_fe sStack_2a0;
  secp256k1_fe sStack_270;
  secp256k1_sha256 *psStack_240;
  ulong uStack_238;
  secp256k1_sha256 *psStack_230;
  secp256k1_modinv64_trans2x2 sStack_228;
  secp256k1_sha256 *psStack_208;
  undefined1 *puStack_200;
  undefined1 auStack_1d8 [56];
  ulong uStack_1a0;
  ulong uStack_198;
  uint64_t uStack_190;
  uint64_t uStack_188;
  undefined4 auStack_180 [2];
  secp256k1_modinv64_signed62 sStack_178;
  secp256k1_fe sStack_150;
  secp256k1_fe *psStack_120;
  secp256k1_sha256 *psStack_118;
  undefined1 auStack_110 [56];
  long lStack_d8;
  long lStack_d0;
  long lStack_c8;
  long lStack_c0;
  int iStack_b8;
  uchar auStack_b4 [12];
  uchar *puStack_a8;
  uint32_t local_84;
  secp256k1_sha256 local_80;
  
  hash_00 = &local_80;
  psVar10 = hash_00;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)psVar10->s = *(undefined8 *)hasher->s;
    hasher = (secp256k1_sha256 *)(hasher->s + 2);
    psVar10 = (secp256k1_sha256 *)(psVar10->s + 2);
  }
  uVar25 = local_80.bytes >> 6;
  local_84 = cnt;
  secp256k1_sha256_write(hash_00,(uchar *)&local_84,4);
  psVar9 = (secp256k1_fe *)out32;
  secp256k1_sha256_finalize(hash_00,out32);
  if (local_80.bytes >> 6 == uVar25 + 1) {
    return;
  }
  secp256k1_ellswift_prng_cold_1();
  psVar10 = (secp256k1_sha256 *)auStack_110;
  psVar16 = (secp256k1_fe *)auStack_110;
  psVar20 = (secp256k1_fe *)auStack_110;
  puVar23 = (undefined1 *)0x1000003d0;
  psStack_118 = (secp256k1_sha256 *)0x151399;
  puStack_a8 = out32;
  secp256k1_fe_verify(psVar9);
  uVar25 = (psVar9->n[4] >> 0x30) * 0x1000003d1 + psVar9->n[0];
  if (((uVar25 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar25 & 0xfffffffffffff) == 0)) {
    uVar8 = (uVar25 >> 0x34) + psVar9->n[1];
    psVar13 = (secp256k1_sha256 *)((uVar8 >> 0x34) + psVar9->n[2]);
    psVar15 = (secp256k1_fe *)(((ulong)psVar13 >> 0x34) + psVar9->n[3]);
    uVar17 = ((ulong)psVar15 >> 0x34) + (psVar9->n[4] & 0xffffffffffff);
    if ((((uVar8 | uVar25 | (ulong)psVar13 | (ulong)psVar15) & 0xfffffffffffff) != 0 || uVar17 != 0)
       && (((uVar25 | 0x1000003d0) & uVar8 & (ulong)psVar13 & (ulong)psVar15 &
           (uVar17 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0015143f;
    psStack_118 = (secp256k1_sha256 *)0x15158c;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
  }
  else {
LAB_0015143f:
    psVar15 = (secp256k1_fe *)(auStack_110 + 0x30);
    psStack_118 = (secp256k1_sha256 *)0x151452;
    secp256k1_fe_mul(psVar15,psVar9,(secp256k1_fe *)hash_00);
    psStack_118 = (secp256k1_sha256 *)0x151460;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,(secp256k1_fe *)hash_00);
    psStack_118 = (secp256k1_sha256 *)0x15146e;
    secp256k1_fe_mul(psVar15,psVar15,(secp256k1_fe *)auStack_110);
    psStack_118 = (secp256k1_sha256 *)0x151479;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,psVar9);
    psStack_118 = (secp256k1_sha256 *)0x151484;
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,(secp256k1_fe *)auStack_110);
    psStack_118 = (secp256k1_sha256 *)0x15148c;
    secp256k1_fe_verify((secp256k1_fe *)auStack_110);
    psVar13 = psVar10;
    psVar15 = psVar16;
    puVar23 = auStack_110;
    if ((int)auStack_110._40_4_ < 5) {
      auStack_110._40_4_ = auStack_110._40_4_ * 7;
      psVar13 = (secp256k1_sha256 *)(auStack_110._0_8_ * 7);
      auStack_110._8_8_ = auStack_110._8_8_ * 7;
      auStack_110._16_8_ = auStack_110._16_8_ * 7;
      auStack_110._24_8_ = auStack_110._24_8_ * 7;
      auStack_110._32_8_ = auStack_110._32_8_ * 7;
      auStack_110._44_4_ = 0;
      psStack_118 = (secp256k1_sha256 *)0x151515;
      auStack_110._0_8_ = psVar13;
      secp256k1_fe_verify((secp256k1_fe *)auStack_110);
      hash_00 = (secp256k1_sha256 *)(auStack_110 + 0x30);
      psStack_118 = (secp256k1_sha256 *)0x151522;
      secp256k1_fe_verify((secp256k1_fe *)hash_00);
      psStack_118 = (secp256k1_sha256 *)0x15152a;
      secp256k1_fe_verify((secp256k1_fe *)auStack_110);
      iStack_b8 = auStack_110._40_4_ + iStack_b8;
      psVar9 = (secp256k1_fe *)auStack_110;
      psVar15 = psVar20;
      puVar23 = auStack_110;
      if (iStack_b8 < 0x21) {
        auStack_110._48_8_ = (long)(uint32_t *)auStack_110._0_8_ + auStack_110._48_8_;
        lStack_d8 = lStack_d8 + auStack_110._8_8_;
        lStack_d0 = lStack_d0 + auStack_110._16_8_;
        lStack_c8 = lStack_c8 + auStack_110._24_8_;
        lStack_c0 = lStack_c0 + auStack_110._32_8_;
        auStack_b4[0] = '\0';
        auStack_b4[1] = '\0';
        auStack_b4[2] = '\0';
        auStack_b4[3] = '\0';
        psStack_118 = (secp256k1_sha256 *)0x151573;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_110 + 0x30));
        psStack_118 = (secp256k1_sha256 *)0x15157b;
        secp256k1_fe_is_square_var((secp256k1_fe *)(auStack_110 + 0x30));
        return;
      }
      goto LAB_00151591;
    }
  }
  psStack_118 = (secp256k1_sha256 *)0x151591;
  secp256k1_ge_x_frac_on_curve_var_cold_3();
LAB_00151591:
  psStack_118 = (secp256k1_sha256 *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_118 = hash_00;
  psStack_120 = psVar9;
  psVar9 = (secp256k1_fe *)auStack_1d8;
  psVar16 = (secp256k1_fe *)auStack_1d8;
  psVar10 = (secp256k1_sha256 *)auStack_1d8;
  auStack_1d8._48_8_ = psVar15->n[0];
  uStack_1a0 = psVar15->n[1];
  uStack_198 = psVar15->n[2];
  uStack_190 = psVar15->n[3];
  uStack_188 = psVar15->n[4];
  auStack_180 = *(undefined4 (*) [2])&psVar15->magnitude;
  secp256k1_fe_verify(psVar15);
  auStack_1d8._0_8_ = psVar15->n[0];
  auStack_1d8._8_8_ = psVar15->n[1];
  auStack_1d8._16_8_ = psVar15->n[2];
  auStack_1d8._24_8_ = psVar15->n[3];
  auStack_1d8._32_8_ = psVar15->n[4];
  auStack_1d8._40_8_ = *(undefined8 *)&psVar15->magnitude;
  secp256k1_fe_normalize_var((secp256k1_fe *)auStack_1d8);
  secp256k1_fe_verify((secp256k1_fe *)auStack_1d8);
  if (auStack_1d8._44_4_ == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((auStack_1d8._16_8_ == 0 && auStack_1d8._24_8_ == 0) &&
        (auStack_1d8._8_8_ == 0 && auStack_1d8._0_8_ == 0)) && auStack_1d8._32_8_ == 0) {
      psVar10 = (secp256k1_sha256 *)0x1;
    }
    else {
      sStack_178.v[0] = (auStack_1d8._8_8_ << 0x34 | auStack_1d8._0_8_) & 0x3fffffffffffffff;
      sStack_178.v[1] =
           (ulong)((uint)auStack_1d8._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_1d8._8_8_ >> 10;
      sStack_178.v[2] =
           (ulong)((uint)auStack_1d8._24_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_1d8._16_8_ >> 0x14;
      sStack_178.v[3] =
           (auStack_1d8._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_1d8._24_8_ >> 0x1e;
      sStack_178.v[4] = (ulong)auStack_1d8._32_8_ >> 0x28;
      uVar1 = secp256k1_jacobi64_maybe_var(&sStack_178,&secp256k1_const_modinfo_fe);
      if (uVar1 == 0) {
        uVar1 = secp256k1_fe_sqrt(&sStack_150,(secp256k1_fe *)auStack_1d8);
        psVar10 = (secp256k1_sha256 *)(ulong)uVar1;
      }
      else {
        psVar10 = (secp256k1_sha256 *)(ulong)(~uVar1 >> 0x1f);
      }
    }
    hash_00 = (secp256k1_sha256 *)(auStack_1d8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)hash_00);
    auStack_1d8._48_8_ = (uStack_188 >> 0x30) * 0x1000003d1 + auStack_1d8._48_8_;
    uStack_1a0 = ((ulong)auStack_1d8._48_8_ >> 0x34) + uStack_1a0;
    uStack_198 = (uStack_1a0 >> 0x34) + uStack_198;
    uVar25 = (uStack_198 >> 0x34) + uStack_190;
    uStack_190 = uVar25 & 0xfffffffffffff;
    uStack_188 = (uVar25 >> 0x34) + (uStack_188 & 0xffffffffffff);
    uStack_198 = uStack_198 & 0xfffffffffffff;
    uStack_1a0 = uStack_1a0 & 0xfffffffffffff;
    auStack_1d8._48_8_ = auStack_1d8._48_8_ & 0xfffffffffffff;
    auStack_180[0] = 1;
    secp256k1_fe_verify((secp256k1_fe *)hash_00);
    psVar13 = hash_00;
    iVar2 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_1d8,(secp256k1_fe *)hash_00);
    psVar9 = psVar16;
    if ((int)psVar10 == iVar2) {
      return;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  puStack_200 = puVar23;
  psStack_208 = psVar10;
  sStack_270.n[4] = *(uint64_t *)psVar13->buf;
  uVar25 = *(ulong *)psVar13->s;
  sStack_270.n[2] = *(uint64_t *)(psVar13->s + 4);
  sStack_270.n[3] = *(uint64_t *)(psVar13->s + 6);
  sStack_270.n[0] = uVar25;
  sStack_270.n[1] = *(uint64_t *)(psVar13->s + 2);
  sStack_2a0.n[0] = psVar9->n[0];
  sStack_2a0.n[1] = psVar9->n[1];
  sStack_2a0.n[2] = psVar9->n[2];
  sStack_2a0.n[3] = psVar9->n[3];
  sStack_2a0.n[4] = psVar9->n[4];
  if (((((long)sStack_2a0.n[0] < 0) || ((long)sStack_2a0.n[1] < 0)) ||
      (psVar10 = psVar13, (long)sStack_2a0.n[2] < 0)) ||
     ((psVar9 = (secp256k1_fe *)sStack_2a0.n[3], (long)sStack_2a0.n[3] < 0 ||
      ((long)sStack_2a0.n[4] < 0)))) {
LAB_00151c1d:
    psStack_2a8 = (secp256k1_sha256 *)0x151c22;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else if (((sStack_2a0.n[2] != 0 || (secp256k1_fe *)sStack_2a0.n[3] != (secp256k1_fe *)0x0) ||
           (sStack_2a0.n[1] != 0 || sStack_2a0.n[0] != 0)) || sStack_2a0.n[4] != 0) {
    hash_00 = (secp256k1_sha256 *)0x5;
    lVar7 = -1;
    uStack_238 = 0;
    psVar11 = (secp256k1_sha256 *)0x0;
    psStack_240 = psVar13;
    do {
      psVar10 = psStack_240;
      psVar16 = (secp256k1_fe *)(sStack_270.n[1] << 0x3e | uVar25);
      puVar18 = (uint64_t *)(sStack_2a0.n[1] << 0x3e | sStack_2a0.n[0]);
      lVar3 = 0;
      psVar21 = (secp256k1_sha256 *)0x0;
      lVar26 = 1;
      iVar2 = 0x3e;
      psVar13 = (secp256k1_sha256 *)0x1;
      puVar19 = puVar18;
      psVar9 = psVar16;
      while( true ) {
        uVar25 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar19;
        lVar4 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        bVar5 = (byte)lVar4;
        psVar20 = (secp256k1_fe *)((ulong)puVar19 >> (bVar5 & 0x3f));
        psVar13 = (secp256k1_sha256 *)((long)psVar13 << (bVar5 & 0x3f));
        lVar3 = lVar3 << (bVar5 & 0x3f);
        lVar7 = lVar7 - lVar4;
        uVar1 = ((uint)((ulong)psVar9 >> 1) ^ (uint)((ulong)psVar9 >> 2)) & (uint)lVar4 ^
                (uint)psVar11;
        iVar2 = iVar2 - (uint)lVar4;
        psStack_230 = hash_00;
        if (iVar2 == 0) break;
        if (((ulong)psVar9 & 1) == 0) {
          psStack_2a8 = (secp256k1_sha256 *)0x151bd2;
          secp256k1_jacobi64_maybe_var_cold_7();
LAB_00151bd2:
          psStack_2a8 = (secp256k1_sha256 *)0x151bd7;
          secp256k1_jacobi64_maybe_var_cold_6();
LAB_00151bd7:
          psStack_2a8 = (secp256k1_sha256 *)0x151bdc;
          secp256k1_jacobi64_maybe_var_cold_1();
LAB_00151bdc:
          psStack_2a8 = (secp256k1_sha256 *)0x151be1;
          secp256k1_jacobi64_maybe_var_cold_2();
          goto LAB_00151be1;
        }
        if (((ulong)psVar20 & 1) == 0) goto LAB_00151bd2;
        bVar5 = 0x3e - (char)iVar2;
        psVar11 = (secp256k1_sha256 *)((long)psVar9 << (bVar5 & 0x3f));
        if ((secp256k1_sha256 *)(lVar3 * (long)puVar18 + (long)psVar13 * (long)psVar16) != psVar11)
        goto LAB_00151bd7;
        psVar11 = (secp256k1_sha256 *)(lVar26 * (long)puVar18 + (long)psVar21 * (long)psVar16);
        if (psVar11 != (secp256k1_sha256 *)((long)psVar20 << (bVar5 & 0x3f))) goto LAB_00151bdc;
        iVar22 = (int)psVar9;
        iVar12 = (int)psVar20;
        if (lVar7 < 0) {
          lVar7 = -lVar7;
          iVar6 = (int)lVar7 + 1;
          if (iVar2 <= iVar6) {
            iVar6 = iVar2;
          }
          if (0xffffffc1 < iVar6 - 0x3fU) {
            psVar11 = (secp256k1_sha256 *)
                      (ulong)(uVar1 ^ (uint)(((ulong)psVar20 & (ulong)psVar9) >> 1));
            uVar25 = (ulong)(0x3fL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU);
            uVar24 = (iVar12 * iVar12 + 0x3e) * iVar12 * iVar22 & (uint)uVar25;
            lVar4 = lVar3;
            lVar3 = lVar26;
            psVar15 = psVar20;
            psVar14 = psVar13;
            psVar13 = psVar21;
            goto LAB_001519ca;
          }
          goto LAB_00151beb;
        }
        iVar6 = (int)lVar7 + 1;
        if (iVar2 <= iVar6) {
          iVar6 = iVar2;
        }
        if (iVar6 - 0x3fU < 0xffffffc2) goto LAB_00151be6;
        uVar25 = (ulong)(0xfL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU);
        uVar24 = -(iVar12 * ((iVar22 * 2 + 2U & 8) + iVar22)) & (uint)uVar25;
        lVar4 = lVar26;
        psVar15 = psVar9;
        psVar14 = psVar21;
        psVar9 = psVar20;
        psVar11 = (secp256k1_sha256 *)(ulong)uVar1;
LAB_001519ca:
        uVar8 = (ulong)uVar24;
        puVar19 = (uint64_t *)((long)psVar9->n + uVar8 * (long)psVar15);
        psVar21 = (secp256k1_sha256 *)((long)psVar14->s + (long)psVar13 * uVar8);
        lVar26 = uVar8 * lVar3 + lVar4;
        psVar9 = psVar15;
        if (((ulong)puVar19 & uVar25) != 0) {
LAB_00151be1:
          psStack_2a8 = (secp256k1_sha256 *)0x151be6;
          secp256k1_jacobi64_maybe_var_cold_4();
LAB_00151be6:
          psStack_2a8 = (secp256k1_sha256 *)0x151beb;
          secp256k1_jacobi64_maybe_var_cold_3();
LAB_00151beb:
          psStack_2a8 = (secp256k1_sha256 *)0x151bf0;
          secp256k1_jacobi64_maybe_var_cold_5();
          goto LAB_00151bf0;
        }
      }
      psVar16 = (secp256k1_fe *)(lVar3 * (long)psVar21);
      lVar4 = (long)psVar13 * lVar26 - (long)psVar16;
      uVar25 = (ulong)((secp256k1_fe *)((long)psVar13 * lVar26) < psVar16);
      uVar8 = SUB168(SEXT816((long)psVar13) * SEXT816(lVar26),8) -
              SUB168(SEXT816(lVar3) * SEXT816((long)psVar21),8);
      sStack_228.u = (int64_t)psVar13;
      sStack_228.v = lVar3;
      sStack_228.q = (int64_t)psVar21;
      sStack_228.r = lVar26;
      if ((lVar4 != 0x4000000000000000 || uVar8 != uVar25) &&
         (uVar8 - uVar25 != -1 || lVar4 != -0x4000000000000000)) {
LAB_00151bf0:
        psStack_2a8 = (secp256k1_sha256 *)0x151bf5;
        secp256k1_jacobi64_maybe_var_cold_16();
        psVar10 = psVar11;
        hash_00 = psVar13;
LAB_00151bf5:
        psStack_2a8 = (secp256k1_sha256 *)0x151bfa;
        secp256k1_jacobi64_maybe_var_cold_15();
LAB_00151bfa:
        psStack_2a8 = (secp256k1_sha256 *)0x151bff;
        secp256k1_jacobi64_maybe_var_cold_14();
LAB_00151bff:
        psStack_2a8 = (secp256k1_sha256 *)0x151c04;
        secp256k1_jacobi64_maybe_var_cold_13();
LAB_00151c04:
        psStack_2a8 = (secp256k1_sha256 *)0x151c09;
        secp256k1_jacobi64_maybe_var_cold_12();
LAB_00151c09:
        psVar9 = psVar16;
        psStack_2a8 = (secp256k1_sha256 *)0x151c0e;
        secp256k1_jacobi64_maybe_var_cold_11();
LAB_00151c0e:
        psStack_2a8 = (secp256k1_sha256 *)0x151c13;
        secp256k1_jacobi64_maybe_var_cold_10();
LAB_00151c13:
        psStack_2a8 = (secp256k1_sha256 *)0x151c18;
        secp256k1_jacobi64_maybe_var_cold_9();
LAB_00151c18:
        psStack_2a8 = (secp256k1_sha256 *)0x151c1d;
        secp256k1_jacobi64_maybe_var_cold_8();
        goto LAB_00151c1d;
      }
      iVar12 = (int)hash_00;
      psStack_2a8 = (secp256k1_sha256 *)0x151a73;
      psVar16 = &sStack_270;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_270,iVar12,
                         (secp256k1_modinv64_signed62 *)psStack_240,0);
      if (iVar2 < 1) goto LAB_00151bf5;
      psStack_2a8 = (secp256k1_sha256 *)0x151a8e;
      psVar16 = &sStack_270;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_270,iVar12,
                         (secp256k1_modinv64_signed62 *)psVar10,1);
      if (0 < iVar2) goto LAB_00151bfa;
      psStack_2a8 = (secp256k1_sha256 *)0x151aa6;
      psVar16 = &sStack_2a0;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_2a0,iVar12,
                         (secp256k1_modinv64_signed62 *)psVar10,0);
      if (iVar2 < 1) goto LAB_00151bff;
      psStack_2a8 = (secp256k1_sha256 *)0x151ac1;
      psVar16 = &sStack_2a0;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_2a0,iVar12,
                         (secp256k1_modinv64_signed62 *)psVar10,1);
      if (-1 < iVar2) goto LAB_00151c04;
      psStack_2a8 = (secp256k1_sha256 *)0x151adc;
      secp256k1_modinv64_update_fg_62_var
                (iVar12,(secp256k1_modinv64_signed62 *)&sStack_270,
                 (secp256k1_modinv64_signed62 *)&sStack_2a0,&sStack_228);
      uVar25 = sStack_270.n[0];
      if (sStack_270.n[0] == 1) {
        if (iVar12 < 2) {
          return;
        }
        psVar13 = (secp256k1_sha256 *)0x1;
        uVar8 = 0;
        do {
          uVar8 = uVar8 | sStack_270.n[(long)psVar13];
          psVar13 = (secp256k1_sha256 *)((long)psVar13->s + 1);
        } while (hash_00 != psVar13);
        if (uVar8 == 0) {
          return;
        }
      }
      lVar3 = (long)iVar12;
      if ((-1 < lVar3 + -2 && sStack_2a0.n[lVar3 + 5] == 0) &&
          (&psStack_2a8)[lVar3] == (secp256k1_sha256 *)0x0) {
        hash_00 = (secp256k1_sha256 *)(ulong)(iVar12 - 1);
      }
      psVar9 = &sStack_270;
      psStack_2a8 = (secp256k1_sha256 *)0x151b43;
      iVar12 = (int)hash_00;
      psVar16 = psVar9;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar9,iVar12,
                         (secp256k1_modinv64_signed62 *)psVar10,0);
      if (iVar2 < 1) goto LAB_00151c09;
      psStack_2a8 = (secp256k1_sha256 *)0x151b5e;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar9,iVar12,
                         (secp256k1_modinv64_signed62 *)psVar10,1);
      if (0 < iVar2) goto LAB_00151c0e;
      psStack_2a8 = (secp256k1_sha256 *)0x151b79;
      psVar9 = &sStack_2a0;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_2a0,iVar12,
                         (secp256k1_modinv64_signed62 *)psVar10,0);
      if (iVar2 < 1) goto LAB_00151c13;
      psStack_2a8 = (secp256k1_sha256 *)0x151b94;
      psVar9 = &sStack_2a0;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_2a0,iVar12,
                         (secp256k1_modinv64_signed62 *)psVar10,1);
      if (-1 < iVar2) goto LAB_00151c18;
      uVar24 = (int)uStack_238 + 1;
      uStack_238 = (ulong)uVar24;
      psVar11 = (secp256k1_sha256 *)(ulong)uVar1;
      if (uVar24 == 0xc) {
        return;
      }
    } while( true );
  }
  psStack_2a8 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_2b0 = psVar10;
  psStack_2a8 = hash_00;
  secp256k1_fe_sqr(&sStack_2e0,psVar9);
  secp256k1_fe_mul(&sStack_2e0,&sStack_2e0,psVar9);
  secp256k1_fe_verify(&sStack_2e0);
  sStack_2e0.n[0] = sStack_2e0.n[0] + 7;
  sStack_2e0.magnitude = sStack_2e0.magnitude + 1;
  sStack_2e0.normalized = 0;
  secp256k1_fe_verify(&sStack_2e0);
  secp256k1_fe_is_square_var(&sStack_2e0);
  return;
}

Assistant:

static void secp256k1_ellswift_prng(unsigned char* out32, const secp256k1_sha256 *hasher, uint32_t cnt) {
    secp256k1_sha256 hash = *hasher;
    unsigned char buf4[4];
#ifdef VERIFY
    size_t blocks = hash.bytes >> 6;
#endif
    buf4[0] = cnt;
    buf4[1] = cnt >> 8;
    buf4[2] = cnt >> 16;
    buf4[3] = cnt >> 24;
    secp256k1_sha256_write(&hash, buf4, 4);
    secp256k1_sha256_finalize(&hash, out32);

    /* Writing and finalizing together should trigger exactly one SHA256 compression. */
    VERIFY_CHECK(((hash.bytes) >> 6) == (blocks + 1));
}